

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_parse_function_generator.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::cpp::ParseFunctionGenerator::GenerateStrings
          (ParseFunctionGenerator *this,Formatter *format,FieldDescriptor *field,bool check_utf8)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  bool bVar3;
  FileOptions_OptimizeMode FVar4;
  Utf8CheckMode UVar5;
  OneofDescriptor *pOVar6;
  char *pcVar7;
  string parser_name;
  string field_name;
  AlphaNum local_b0;
  string local_80;
  AlphaNum local_60;
  
  paVar1 = &parser_name.field_2;
  if (this->options_->opensource_runtime == true) {
LAB_002e71e3:
    parser_name.field_2._M_local_buf[0] = '\0';
    parser_name._M_string_length = 0;
    parser_name._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::assign((char *)&parser_name);
LAB_002e71f4:
    local_b0.piece_data_ = "_internal_";
LAB_002e72c3:
    if ((~(byte)field[1] & 0x60) == 0) {
      bVar3 = FieldDescriptor::is_packable(field);
      local_60.piece_data_ = "add";
      if (bVar3) {
        local_60.piece_data_ = "mutable";
      }
    }
    else {
      local_60.piece_data_ = "mutable";
    }
    Formatter::operator()
              (format,
               "auto str = $msg$$1$$2$_$name$();\nptr = ::$proto_ns$::internal::Inline$3$(str, ptr, ctx);\n"
               ,&local_b0.piece_data_,&local_60.piece_data_,&parser_name);
    std::__cxx11::string::~string((string *)&parser_name);
  }
  else {
    iVar2 = *(int *)(*(long *)(field + 0x38) + 0x48);
    if (((((~(byte)field[1] & 0x60) == 0) ||
         (FVar4 = GetOptimizeFor(*(FileDescriptor **)(field + 0x10),this->options_),
         FVar4 == FileOptions_OptimizeMode_LITE_RUNTIME)) ||
        (*(long *)(*(long *)(field + 0x40) + 8) != 0)) ||
       (pOVar6 = FieldDescriptor::real_containing_oneof(field),
       iVar2 != 0 || pOVar6 != (OneofDescriptor *)0x0)) {
      parser_name._M_string_length = 0;
      parser_name.field_2._M_local_buf[0] = '\0';
      if (iVar2 == 2) {
        parser_name._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::assign((char *)&parser_name);
      }
      else {
        if (iVar2 == 1) {
          parser_name._M_dataplus._M_p = (pointer)paVar1;
          std::__cxx11::string::assign((char *)&parser_name);
          goto LAB_002e71f4;
        }
        parser_name._M_dataplus._M_p = (pointer)paVar1;
        if (iVar2 == 0) goto LAB_002e71e3;
      }
      local_b0.piece_data_ = "";
      goto LAB_002e72c3;
    }
    GenerateArenaString(this,format,field);
  }
  if (!check_utf8) {
    return;
  }
  UVar5 = GetUtf8CheckMode(field,this->options_);
  if (UVar5 == kNone) {
    return;
  }
  if (UVar5 == kVerify) {
    pcVar7 = "#ifndef NDEBUG\n";
LAB_002e735e:
    Formatter::operator()<>(format,pcVar7);
  }
  else if (UVar5 == kStrict) {
    pcVar7 = "CHK_(";
    goto LAB_002e735e;
  }
  field_name._M_dataplus._M_p = (pointer)&field_name.field_2;
  field_name._M_string_length = 0;
  field_name.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::assign((char *)&field_name);
  bVar3 = HasDescriptorMethods(*(FileDescriptor **)(field + 0x10),this->options_);
  if (bVar3) {
    parser_name._M_dataplus._M_p = "\"";
    parser_name._M_string_length = 1;
    local_b0.piece_data_ = *(char **)(*(long *)(field + 8) + 0x20);
    local_b0.piece_size_ = *(size_t *)(*(long *)(field + 8) + 0x28);
    local_60.piece_data_ = "\"";
    local_60.piece_size_ = 1;
    StrCat_abi_cxx11_(&local_80,(protobuf *)&parser_name,&local_b0,&local_60,
                      (AlphaNum *)local_b0.piece_data_);
    std::__cxx11::string::operator=((string *)&field_name,(string *)&local_80);
    std::__cxx11::string::~string((string *)&local_80);
  }
  Formatter::operator()(format,"::$proto_ns$::internal::VerifyUTF8(str, $1$)",&field_name);
  if (UVar5 == kVerify) {
    pcVar7 = ";\n#endif  // !NDEBUG\n";
  }
  else {
    if (UVar5 != kStrict) goto LAB_002e7435;
    pcVar7 = ");\n";
  }
  Formatter::operator()<>(format,pcVar7);
LAB_002e7435:
  std::__cxx11::string::~string((string *)&field_name);
  return;
}

Assistant:

void ParseFunctionGenerator::GenerateStrings(Formatter& format,
                                             const FieldDescriptor* field,
                                             bool check_utf8) {
  FieldOptions::CType ctype = FieldOptions::STRING;
  if (!options_.opensource_runtime) {
    // Open source doesn't support other ctypes;
    ctype = field->options().ctype();
  }
  if (!field->is_repeated() && !options_.opensource_runtime &&
      GetOptimizeFor(field->file(), options_) != FileOptions::LITE_RUNTIME &&
      // For now only use arena string for strings with empty defaults.
      field->default_value_string().empty() &&
      !field->real_containing_oneof() && ctype == FieldOptions::STRING) {
    GenerateArenaString(format, field);
  } else {
    std::string parser_name;
    switch (ctype) {
      case FieldOptions::STRING:
        parser_name = "GreedyStringParser";
        break;
      case FieldOptions::CORD:
        parser_name = "CordParser";
        break;
      case FieldOptions::STRING_PIECE:
        parser_name = "StringPieceParser";
        break;
    }
    format(
        "auto str = $msg$$1$$2$_$name$();\n"
        "ptr = ::$proto_ns$::internal::Inline$3$(str, ptr, ctx);\n",
        HasInternalAccessors(ctype) ? "_internal_" : "",
        field->is_repeated() && !field->is_packable() ? "add" : "mutable",
        parser_name);
  }
  if (!check_utf8) return;  // return if this is a bytes field
  auto level = GetUtf8CheckMode(field, options_);
  switch (level) {
    case Utf8CheckMode::kNone:
      return;
    case Utf8CheckMode::kVerify:
      format("#ifndef NDEBUG\n");
      break;
    case Utf8CheckMode::kStrict:
      format("CHK_(");
      break;
  }
  std::string field_name;
  field_name = "nullptr";
  if (HasDescriptorMethods(field->file(), options_)) {
    field_name = StrCat("\"", field->full_name(), "\"");
  }
  format("::$proto_ns$::internal::VerifyUTF8(str, $1$)", field_name);
  switch (level) {
    case Utf8CheckMode::kNone:
      return;
    case Utf8CheckMode::kVerify:
      format(
          ";\n"
          "#endif  // !NDEBUG\n");
      break;
    case Utf8CheckMode::kStrict:
      format(");\n");
      break;
  }
}